

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh.cpp
# Opt level: O2

void __thiscall CGL::GLScene::Mesh::split_selected_edge(Mesh *this)

{
  split_selected_edge((Mesh *)&this[-1].bsdf);
  return;
}

Assistant:

void Mesh::split_selected_edge() {
  HalfedgeElement *element = selectedFeature.element;
  if (element == nullptr) return;
  Edge *edge = element->getEdge();
  if (edge == nullptr) return;
  mesh.splitEdge(edge->halfedge()->edge());
  invalidate_selection();
}